

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O0

bool __thiscall QtMWidgets::ListModel<QImage>::removeRows(ListModel<QImage> *this,int row,int count)

{
  ListModelPrivate<QImage> *pLVar1;
  qsizetype qVar2;
  int local_24;
  int i;
  int count_local;
  int row_local;
  ListModel<QImage> *this_local;
  
  pLVar1 = QScopedPointer<QtMWidgets::ListModelPrivate<QImage>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QImage>_>_>
           ::operator->(&this->d);
  qVar2 = QList<QImage>::count(&pLVar1->data);
  if (qVar2 < row + count) {
    this_local._7_1_ = false;
  }
  else {
    for (local_24 = 0; local_24 < count; local_24 = local_24 + 1) {
      pLVar1 = QScopedPointer<QtMWidgets::ListModelPrivate<QImage>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QImage>_>_>
               ::operator->(&this->d);
      QList<QImage>::removeAt(&pLVar1->data,(long)row);
    }
    AbstractListModel::rowsRemoved(&this->super_AbstractListModel,row,row + count + -1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool removeRows( int row, int count )
	{
		if( row + count > d->data.count() )
			return false;

		for( int i = 0; i < count; ++i )
			d->data.removeAt( row );

		emit rowsRemoved( row, row + count - 1 );

		return true;
	}